

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O2

int DispatchAlpha_C(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,int dst_stride
                   )

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  
  iVar3 = 0;
  uVar2 = (ulong)(uint)width;
  if (width < 1) {
    uVar2 = 0;
  }
  if (height < 1) {
    height = iVar3;
  }
  bVar4 = 0xff;
  for (; iVar3 != height; iVar3 = iVar3 + 1) {
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      bVar1 = alpha[uVar5];
      dst[uVar5 * 4] = bVar1;
      bVar4 = bVar4 & bVar1;
    }
    alpha = alpha + alpha_stride;
    dst = dst + dst_stride;
  }
  return (int)(bVar4 != 0xff);
}

Assistant:

static int DispatchAlpha_C(const uint8_t* WEBP_RESTRICT alpha, int alpha_stride,
                           int width, int height,
                           uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  uint32_t alpha_mask = 0xff;
  int i, j;

  for (j = 0; j < height; ++j) {
    for (i = 0; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }

  return (alpha_mask != 0xff);
}